

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hxx
# Opt level: O3

future<void> __thiscall
ThreadPool::submit<void(&)(int,int,int),int&,int&,int&>
          (ThreadPool *this,_func_void_int_int_int *f,int *args,int *args_1,int *args_2)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_R9;
  future<void> fVar3;
  long *local_50;
  packaged_task<void_(int,_int,_int)> local_48;
  unique_ptr *local_38;
  
  local_38 = (unique_ptr *)f;
  plVar1 = (long *)operator_new(0x30);
  *plVar1 = (long)&PTR__WorkItem_00109b48;
  plVar1[1] = in_R9;
  plVar1[2] = (long)args_2;
  plVar1[3] = (long)args_1;
  local_48._M_state.
  super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__future_base::_Task_state<void(*)(int,int,int),std::allocator<int>,void(int,int,int)>,std::allocator<int>,void(&)(int,int,int),std::allocator<int>const&>
            (&local_48._M_state.
              super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (_Task_state<void_(*)(int,_int,_int),_std::allocator<int>,_void_(int,_int,_int)> **)
             &local_48,(allocator<int> *)&local_50,(_func_void_int_int_int *)args,
             (allocator<int> *)&local_50);
  plVar1[4] = (long)local_48._M_state.
                    super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
  plVar1[5] = (long)local_48._M_state.
                    super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
  std::packaged_task<void_(int,_int,_int)>::get_future(&local_48);
  local_50 = plVar1;
  WorkItemScheduler::submit(local_38);
  _Var2._M_pi = extraout_RDX;
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 8))();
    _Var2._M_pi = extraout_RDX_00;
  }
  *(element_type **)this =
       local_48._M_state.
       super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
       local_48._M_state.
       super___shared_ptr<std::__future_base::_Task_state_base<void_(int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  fVar3.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  fVar3.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<void>)
         fVar3.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto ThreadPool::submit(Function&& f, Args&&... args)
{
    auto wi_ptr = std::make_unique<WorkItem<Function, Args...>>(f, args...);
    auto future = wi_ptr->get_future();
    this->sched_.submit(std::move(wi_ptr));

    return future;
}